

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPipeConnection.cxx
# Opt level: O0

void __thiscall
cmPipeConnection::cmPipeConnection
          (cmPipeConnection *this,string *name,cmConnectionBufferStrategy *bufferStrategy)

{
  cmConnectionBufferStrategy *bufferStrategy_local;
  string *name_local;
  cmPipeConnection *this_local;
  
  cmEventBasedConnection::cmEventBasedConnection(&this->super_cmEventBasedConnection,bufferStrategy)
  ;
  (this->super_cmEventBasedConnection).super_cmConnection._vptr_cmConnection =
       (_func_int **)&PTR_WriteData_00acdba0;
  std::__cxx11::string::string((string *)&this->PipeName,(string *)name);
  ::cm::uv_pipe_ptr::uv_pipe_ptr(&this->ServerPipe);
  return;
}

Assistant:

cmPipeConnection::cmPipeConnection(std::string name,
                                   cmConnectionBufferStrategy* bufferStrategy)
  : cmEventBasedConnection(bufferStrategy)
  , PipeName(std::move(name))
{
}